

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O0

bool __thiscall Js::ObjectPropertyEnumerator::MoveNext(ObjectPropertyEnumerator *this)

{
  JavascriptLibrary *this_00;
  JavascriptString *pJVar1;
  Var pvVar2;
  int local_34;
  JavascriptString *pJStack_30;
  PropertyId propertyId;
  Var propertyName;
  Var undefined;
  ScriptContext *scriptContext;
  ObjectPropertyEnumerator *this_local;
  
  if (this->m_innerEnumerator == (JavascriptStaticEnumerator *)0x0) {
LAB_01602630:
    this_local._7_1_ = false;
  }
  else {
    scriptContext = (ScriptContext *)this;
    undefined = ScriptContextHolder::GetScriptContext(&this->super_ScriptContextHolder);
    this_00 = ScriptContext::GetLibrary((ScriptContext *)undefined);
    propertyName = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
    do {
      pJStack_30 = JavascriptStaticEnumerator::MoveAndGetNext
                             (this->m_innerEnumerator,&local_34,(PropertyAttributes *)0x0);
      if (pJStack_30 == (JavascriptString *)0x0) {
        this->m_innerEnumerator = (JavascriptStaticEnumerator *)0x0;
        goto LAB_01602630;
      }
    } while (pJStack_30 == (JavascriptString *)propertyName);
    pJVar1 = VarTo<Js::JavascriptString>(pJStack_30);
    this->m_name = pJVar1;
    if (local_34 == -1) {
      pvVar2 = Js::JavascriptOperators::OP_GetElementI
                         (this->m_obj,pJStack_30,(ScriptContext *)undefined);
      this->m_value = pvVar2;
    }
    else {
      pvVar2 = Js::JavascriptOperators::GetProperty
                         (this->m_obj,local_34,(ScriptContext *)undefined,(PropertyValueInfo *)0x0);
      this->m_value = pvVar2;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ObjectPropertyEnumerator::MoveNext()
    {
        if (m_innerEnumerator)
        {
            ScriptContext* scriptContext = this->GetScriptContext();
            Var undefined = scriptContext->GetLibrary()->GetUndefined();
            Var propertyName;
            PropertyId propertyId;

            while ((propertyName = m_innerEnumerator->MoveAndGetNext(propertyId)) != NULL)
            {
                if (propertyName != undefined) //There are some code paths in which GetCurrentIndex can return undefined
                {
                    m_name = VarTo<JavascriptString>(propertyName);

                    if (propertyId != Constants::NoProperty)
                    {
                        m_value = JavascriptOperators::GetProperty(m_obj, propertyId, scriptContext);
                    }
                    else
                    {
                        m_value = JavascriptOperators::OP_GetElementI(m_obj, propertyName, scriptContext);
                    }

                    return true;
                }
            }

            // No more properties, mark end
            m_innerEnumerator = NULL;
        }

        return false;
    }